

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_value_objectwriter.cc
# Opt level: O2

DefaultValueObjectWriter * __thiscall
google::protobuf::util::converter::DefaultValueObjectWriter::StartList
          (DefaultValueObjectWriter *this,StringPiece name)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  Type *pTVar4;
  int iVar5;
  Node *pNVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Node *pNVar7;
  Node **__x;
  function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_google::protobuf::Field_*)>
  local_f8;
  function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_google::protobuf::Field_*)>
  local_d8;
  undefined1 auStack_b8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  path;
  undefined1 local_98 [8];
  StringPiece name_local;
  undefined **local_68;
  undefined4 local_60;
  undefined4 local_58;
  undefined1 local_48;
  Node **local_40;
  byte local_31;
  
  name_local.ptr_ = (char *)name.length_;
  local_98 = (undefined1  [8])name.ptr_;
  if (this->current_ == (Node *)0x0) {
    auStack_b8 = (undefined1  [8])0x0;
    path.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    path.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    StringPiece::ToString_abi_cxx11_((string *)&name_local.length_,(StringPiece *)local_98);
    pTVar4 = this->type_;
    local_68 = &PTR__DataPiece_003e3c20;
    local_60 = 0xb;
    local_58 = 0;
    local_48 = 0;
    bVar1 = this->suppress_empty_list_;
    bVar2 = this->preserve_proto_field_names_;
    bVar3 = this->use_ints_for_enums_;
    std::
    function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_google::protobuf::Field_*)>
    ::function(&local_f8,&this->field_scrub_callback_);
    iVar5 = (*(this->super_ObjectWriter)._vptr_ObjectWriter[0x11])
                      (this,&name_local.length_,pTVar4,2,&local_68,0,auStack_b8,(ulong)bVar1,
                       (ulong)bVar2,(ulong)bVar3,&local_f8);
    pNVar6 = (this->root_)._M_t.
             super___uniq_ptr_impl<google::protobuf::util::converter::DefaultValueObjectWriter::Node,_std::default_delete<google::protobuf::util::converter::DefaultValueObjectWriter::Node>_>
             ._M_t.
             super__Tuple_impl<0UL,_google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::default_delete<google::protobuf::util::converter::DefaultValueObjectWriter::Node>_>
             .
             super__Head_base<0UL,_google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_false>
             ._M_head_impl;
    (this->root_)._M_t.
    super___uniq_ptr_impl<google::protobuf::util::converter::DefaultValueObjectWriter::Node,_std::default_delete<google::protobuf::util::converter::DefaultValueObjectWriter::Node>_>
    ._M_t.
    super__Tuple_impl<0UL,_google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::default_delete<google::protobuf::util::converter::DefaultValueObjectWriter::Node>_>
    .
    super__Head_base<0UL,_google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_false>
    ._M_head_impl = (Node *)CONCAT44(extraout_var_00,iVar5);
    if (pNVar6 != (Node *)0x0) {
      (*pNVar6->_vptr_Node[1])();
    }
    std::_Function_base::~_Function_base(&local_f8.super__Function_base);
    std::__cxx11::string::~string((string *)&name_local.length_);
    this->current_ =
         (this->root_)._M_t.
         super___uniq_ptr_impl<google::protobuf::util::converter::DefaultValueObjectWriter::Node,_std::default_delete<google::protobuf::util::converter::DefaultValueObjectWriter::Node>_>
         ._M_t.
         super__Tuple_impl<0UL,_google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::default_delete<google::protobuf::util::converter::DefaultValueObjectWriter::Node>_>
         .
         super__Head_base<0UL,_google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_false>
         ._M_head_impl;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)auStack_b8);
  }
  else {
    __x = &this->current_;
    MaybePopulateChildrenOfAny(this,this->current_);
    pNVar6 = Node::FindChild(this->current_,name);
    if ((pNVar6 == (Node *)0x0) || (pNVar6->kind_ != LIST)) {
      local_40 = __x;
      StringPiece::ToString_abi_cxx11_((string *)&name_local.length_,(StringPiece *)local_98);
      local_68 = &PTR__DataPiece_003e3c20;
      local_60 = 0xb;
      local_58 = 0;
      local_48 = 0;
      pNVar7 = this->current_;
      local_31 = this->suppress_empty_list_;
      bVar1 = this->preserve_proto_field_names_;
      bVar2 = this->use_ints_for_enums_;
      std::
      function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_google::protobuf::Field_*)>
      ::function(&local_d8,&this->field_scrub_callback_);
      if (pNVar6 != (Node *)0x0) {
        pNVar7 = pNVar6;
      }
      iVar5 = (*(this->super_ObjectWriter)._vptr_ObjectWriter[0x11])
                        (this,&name_local.length_,0,2,&local_68,0,&pNVar7->path_,(ulong)local_31,
                         (ulong)bVar1,(ulong)bVar2,&local_d8);
      pNVar6 = (Node *)CONCAT44(extraout_var,iVar5);
      std::_Function_base::~_Function_base(&local_d8.super__Function_base);
      std::__cxx11::string::~string((string *)&name_local.length_);
      __x = local_40;
      Node::AddChild(*local_40,pNVar6);
    }
    pNVar6->is_placeholder_ = false;
    std::
    deque<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
    ::push_back(&(this->stack_).c,__x);
    this->current_ = pNVar6;
  }
  return this;
}

Assistant:

DefaultValueObjectWriter* DefaultValueObjectWriter::StartList(
    StringPiece name) {
  if (current_ == nullptr) {
    std::vector<std::string> path;
    root_.reset(CreateNewNode(std::string(name), &type_, LIST,
                              DataPiece::NullData(), false, path,
                              suppress_empty_list_, preserve_proto_field_names_,
                              use_ints_for_enums_, field_scrub_callback_));
    current_ = root_.get();
    return this;
  }
  MaybePopulateChildrenOfAny(current_);
  Node* child = current_->FindChild(name);
  if (child == nullptr || child->kind() != LIST) {
    std::unique_ptr<Node> node(CreateNewNode(
        std::string(name), nullptr, LIST, DataPiece::NullData(), false,
        child == nullptr ? current_->path() : child->path(),
        suppress_empty_list_, preserve_proto_field_names_, use_ints_for_enums_,
        field_scrub_callback_));
    child = node.get();
    current_->AddChild(node.release());
  }
  child->set_is_placeholder(false);

  stack_.push(current_);
  current_ = child;
  return this;
}